

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

void __thiscall
slang::ast::DeclaredType::setFromDeclarator(DeclaredType *this,DeclaratorSyntax *decl)

{
  bool bVar1;
  ExpressionSyntax *syntax;
  SourceLocation loc;
  long in_RSI;
  DeclaredType *in_RDI;
  
  bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                    ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                     0x499b2a);
  if (!bVar1) {
    setDimensionSyntax(in_RDI,(SyntaxList<slang::syntax::VariableDimensionSyntax> *)(in_RSI + 0x28))
    ;
  }
  if (*(long *)(in_RSI + 0x60) != 0) {
    syntax = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x499b5f);
    loc = parsing::Token::location((Token *)(*(long *)(in_RSI + 0x60) + 0x18));
    setInitializerSyntax(in_RDI,syntax,loc);
  }
  return;
}

Assistant:

void DeclaredType::setFromDeclarator(const DeclaratorSyntax& decl) {
    if (!decl.dimensions.empty())
        setDimensionSyntax(decl.dimensions);
    if (decl.initializer)
        setInitializerSyntax(*decl.initializer->expr, decl.initializer->equals.location());
}